

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetPipelineShadingRateFlagsString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,PIPELINE_SHADING_RATE_FLAGS Flags)

{
  ulong uVar1;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  PIPELINE_SHADING_RATE_FLAGS Bit;
  allocator local_12;
  PIPELINE_SHADING_RATE_FLAGS local_11;
  String *pSStack_10;
  PIPELINE_SHADING_RATE_FLAGS Flags_local;
  String *Result;
  
  local_11 = (PIPELINE_SHADING_RATE_FLAGS)this;
  pSStack_10 = __return_storage_ptr__;
  if (local_11 == PIPELINE_SHADING_RATE_FLAG_NONE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"NONE",&local_12);
    std::allocator<char>::~allocator((allocator<char> *)&local_12);
  }
  else {
    msg.field_2._M_local_buf[0xb] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    while (local_11 != PIPELINE_SHADING_RATE_FLAG_NONE) {
      msg.field_2._M_local_buf[10] = ExtractLSB<Diligent::PIPELINE_SHADING_RATE_FLAGS>(&local_11);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," | ");
      }
      if (msg.field_2._M_local_buf[10] == '\x01') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"PER_PRIMITIVE");
      }
      else if (msg.field_2._M_local_buf[10] == '\x02') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"TEXTURE_BASED");
      }
      else {
        FormatString<char[33]>((string *)local_48,(char (*) [33])"Unexpected pipeline shading rate")
        ;
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetPipelineShadingRateFlagsString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0xaf7);
        std::__cxx11::string::~string((string *)local_48);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Unknown");
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetPipelineShadingRateFlagsString(PIPELINE_SHADING_RATE_FLAGS Flags)
{
    if (Flags == PIPELINE_SHADING_RATE_FLAG_NONE)
        return "NONE";

    String Result;
    while (Flags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        PIPELINE_SHADING_RATE_FLAGS Bit = ExtractLSB(Flags);

        if (!Result.empty())
            Result += " | ";

        static_assert(PIPELINE_SHADING_RATE_FLAG_LAST == 0x02, "Please update the switch below to handle the new pipeline shading rate flag");
        switch (Bit)
        {
            // clang-format off
            case PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE: Result += "PER_PRIMITIVE"; break;
            case PIPELINE_SHADING_RATE_FLAG_TEXTURE_BASED: Result += "TEXTURE_BASED"; break;
            // clang-format on
            default:
                UNEXPECTED("Unexpected pipeline shading rate");
                Result += "Unknown";
        }
    }
    return Result;
}